

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O0

void dataDeviceHandleDrop(void *userData,wl_data_device *device)

{
  char *pcVar1;
  char **ppcVar2;
  int *in_RDI;
  char *unaff_retaddr;
  wl_data_offer *in_stack_00000008;
  int i;
  char **paths;
  int count;
  char *string;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar3;
  undefined4 local_1c;
  
  if (_glfw.wl.dragOffer != (wl_data_offer *)0x0) {
    pcVar1 = readDataOfferAsString(in_stack_00000008,unaff_retaddr);
    if (pcVar1 != (char *)0x0) {
      ppcVar2 = _glfwParseUriList(unaff_retaddr,in_RDI);
      if (ppcVar2 != (char **)0x0) {
        _glfwInputDrop((_GLFWwindow *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffcc,(char **)0x9df703);
      }
      for (iVar3 = 0; iVar3 < local_1c; iVar3 = iVar3 + 1) {
        _glfw_free((void *)0x9df728);
      }
      _glfw_free((void *)0x9df73f);
    }
    _glfw_free((void *)0x9df749);
  }
  return;
}

Assistant:

static void dataDeviceHandleDrop(void* userData,
                                 struct wl_data_device* device)
{
    if (!_glfw.wl.dragOffer)
        return;

    char* string = readDataOfferAsString(_glfw.wl.dragOffer, "text/uri-list");
    if (string)
    {
        int count;
        char** paths = _glfwParseUriList(string, &count);
        if (paths)
            _glfwInputDrop(_glfw.wl.dragFocus, count, (const char**) paths);

        for (int i = 0; i < count; i++)
            _glfw_free(paths[i]);

        _glfw_free(paths);
    }

    _glfw_free(string);
}